

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall cmGraphVizWriter::WritePerTargetFiles(cmGraphVizWriter *this,char *fileName)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  TargetType TVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  cmGraphVizWriter *this_00;
  string currentFilename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedNodes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedConnections;
  cmGeneratedFileStream str;
  long *local_300;
  long local_2f8;
  long local_2f0 [2];
  char *local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_278 [584];
  
  if (this->GeneratePerTarget == true) {
    local_2e0 = fileName;
    CollectTargetsAndLibs(this);
    p_Var5 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        if (*(cmGeneratorTarget **)(p_Var5 + 2) != (cmGeneratorTarget *)0x0) {
          TVar3 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var5 + 2));
          switch(TVar3) {
          case EXECUTABLE:
            if (this->GenerateForExecutables != true) goto switchD_00436058_default;
            goto LAB_00436095;
          case STATIC_LIBRARY:
            cVar2 = this->GenerateForStaticLibs;
            break;
          case SHARED_LIBRARY:
            cVar2 = this->GenerateForSharedLibs;
            break;
          case MODULE_LIBRARY:
            cVar2 = this->GenerateForModuleLibs;
            break;
          default:
            goto switchD_00436058_default;
          }
          if (cVar2 != '\0') {
LAB_00436095:
            local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2a8._M_impl.super__Rb_tree_header._M_header;
            local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2d8._M_impl.super__Rb_tree_header._M_header;
            local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
            local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
            std::__cxx11::string::string((string *)&local_300,local_2e0,(allocator *)local_278);
            std::__cxx11::string::append((char *)&local_300);
            std::__cxx11::string::_M_append((char *)&local_300,*(ulong *)(p_Var5 + 1));
            cmGeneratedFileStream::cmGeneratedFileStream
                      ((cmGeneratedFileStream *)local_278,(char *)local_300,false,None);
            if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) !=
                0) {
              cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
              if (local_300 != local_2f0) {
                operator_delete(local_300,local_2f0[0] + 1);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&local_2d8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&local_2a8);
              return;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing ",8);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_300,local_2f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"...",3);
            std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            WriteHeader(this,(cmGeneratedFileStream *)local_278);
            this_00 = this;
            WriteConnections(this,(string *)(p_Var5 + 1),
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_2d8,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_2a8,(cmGeneratedFileStream *)local_278);
            WriteFooter(this_00,(cmGeneratedFileStream *)local_278);
            cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
            if (local_300 != local_2f0) {
              operator_delete(local_300,local_2f0[0] + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_2d8);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_2a8);
          }
        }
switchD_00436058_default:
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WritePerTargetFiles(const char* fileName)
{
  if (!this->GeneratePerTarget) {
    return;
  }

  this->CollectTargetsAndLibs();

  for (std::map<std::string, const cmGeneratorTarget*>::const_iterator ptrIt =
         this->TargetPtrs.begin();
       ptrIt != this->TargetPtrs.end(); ++ptrIt) {
    if (ptrIt->second == CM_NULLPTR) {
      continue;
    }

    if (!this->GenerateForTargetType(ptrIt->second->GetType())) {
      continue;
    }

    std::set<std::string> insertedConnections;
    std::set<std::string> insertedNodes;

    std::string currentFilename = fileName;
    currentFilename += ".";
    currentFilename += ptrIt->first;
    cmGeneratedFileStream str(currentFilename.c_str());
    if (!str) {
      return;
    }

    std::cout << "Writing " << currentFilename << "..." << std::endl;
    this->WriteHeader(str);

    this->WriteConnections(ptrIt->first, insertedNodes, insertedConnections,
                           str);
    this->WriteFooter(str);
  }
}